

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> * __thiscall
cmGeneratorTarget::GetUtilityItems(cmGeneratorTarget *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmGeneratorTarget *t;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  cmListFileBacktrace local_a8;
  string local_98;
  cmListFileBacktrace local_78;
  cmLinkItem local_68;
  
  if (this->UtilityItemsDone == false) {
    this->UtilityItemsDone = true;
    p_Var2 = (this->Target->Utilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var3 = &(this->Target->Utilities)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var2 != p_Var3) {
      paVar1 = &local_68.String.field_2;
      do {
        t = cmLocalGenerator::FindGeneratorTargetToUse(this->LocalGenerator,(string *)(p_Var2 + 1));
        if (t == (cmGeneratorTarget *)0x0) {
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_98,*(long *)(p_Var2 + 1),
                     (long)&(p_Var2[1]._M_parent)->_M_color + *(long *)(p_Var2 + 1));
          local_a8.TopEntry.
          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(element_type **)(p_Var2 + 2);
          local_a8.TopEntry.
          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2[2]._M_parent;
          if ((_Base_ptr)
              local_a8.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Base_ptr)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&((_Base_ptr)
                       local_a8.TopEntry.
                       super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi)->_M_parent =
                   *(int *)&((_Base_ptr)
                            local_a8.TopEntry.
                            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi)->_M_parent + 1;
              UNLOCK();
            }
            else {
              *(int *)&((_Base_ptr)
                       local_a8.TopEntry.
                       super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi)->_M_parent =
                   *(int *)&((_Base_ptr)
                            local_a8.TopEntry.
                            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi)->_M_parent + 1;
            }
          }
          cmLinkItem::cmLinkItem(&local_68,&local_98,&local_a8);
          std::
          _Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
          ::_M_insert_unique<cmLinkItem>(&(this->UtilityItems)._M_t,&local_68);
          if (local_68.Backtrace.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_68.Backtrace.TopEntry.
                       super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68.String._M_dataplus._M_p != paVar1) {
            operator_delete(local_68.String._M_dataplus._M_p,
                            local_68.String.field_2._M_allocated_capacity + 1);
          }
          if ((_Base_ptr)
              local_a8.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Base_ptr)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_a8.TopEntry.
                       super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          local_78.TopEntry.
          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(element_type **)(p_Var2 + 2);
          local_78.TopEntry.
          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2[2]._M_parent;
          if ((_Base_ptr)
              local_78.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Base_ptr)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&((_Base_ptr)
                       local_78.TopEntry.
                       super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi)->_M_parent =
                   *(int *)&((_Base_ptr)
                            local_78.TopEntry.
                            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi)->_M_parent + 1;
              UNLOCK();
            }
            else {
              *(int *)&((_Base_ptr)
                       local_78.TopEntry.
                       super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi)->_M_parent =
                   *(int *)&((_Base_ptr)
                            local_78.TopEntry.
                            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi)->_M_parent + 1;
            }
          }
          cmLinkItem::cmLinkItem(&local_68,t,&local_78);
          std::
          _Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
          ::_M_insert_unique<cmLinkItem>(&(this->UtilityItems)._M_t,&local_68);
          if (local_68.Backtrace.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_68.Backtrace.TopEntry.
                       super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68.String._M_dataplus._M_p != paVar1) {
            operator_delete(local_68.String._M_dataplus._M_p,
                            local_68.String.field_2._M_allocated_capacity + 1);
          }
          if ((_Base_ptr)
              local_78.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Base_ptr)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.TopEntry.
                       super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
        }
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
      } while ((_Rb_tree_header *)p_Var2 != p_Var3);
    }
  }
  return &this->UtilityItems;
}

Assistant:

std::set<cmLinkItem> const& cmGeneratorTarget::GetUtilityItems() const
{
  if (!this->UtilityItemsDone) {
    this->UtilityItemsDone = true;
    std::set<BT<std::string>> const& utilities = this->GetUtilities();
    for (BT<std::string> const& i : utilities) {
      if (cmGeneratorTarget* gt =
            this->LocalGenerator->FindGeneratorTargetToUse(i.Value)) {
        this->UtilityItems.insert(cmLinkItem(gt, i.Backtrace));
      } else {
        this->UtilityItems.insert(cmLinkItem(i.Value, i.Backtrace));
      }
    }
  }
  return this->UtilityItems;
}